

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall
BuildWithLogTestRestatSingleDependentOutputDirty::Run
          (BuildWithLogTestRestatSingleDependentOutputDirty *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Builder *this_01;
  int *piVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  string err;
  string local_90;
  string local_70;
  string local_50;
  
  iVar4 = g_current_test->assertion_failures_;
  state = &(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule true\n  command = true\n  restat = 1\nrule touch\n  command = touch\nbuild out1: true in\nbuild out2 out3: touch out1\nbuild out4: touch out2\n"
              ,(ManifestParserOptions)0x0);
  if (iVar4 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"in","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  this_00 = &(this->super_BuildWithLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  pTVar2 = g_current_test;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"out4","");
  this_01 = &(this->super_BuildWithLogTest).super_BuildTest.builder_;
  pNVar5 = Builder::AddTarget(this_01,&local_90,&local_70);
  testing::Test::Check
            (pTVar2,pNVar5 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x6c3,"builder_.AddTarget(\"out4\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_70);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar4 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x6c4,"\"\" == err");
  pTVar2 = g_current_test;
  if (bVar3) {
    bVar3 = Builder::Build(this_01,&local_70);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x6c5,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    iVar4 = std::__cxx11::string::compare((char *)&local_70);
    bVar3 = testing::Test::Check
                      (pTVar2,iVar4 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x6c6,"\"\" == err");
    if ((bVar3) &&
       (bVar3 = testing::Test::Check
                          (g_current_test,
                           (long)*(pointer *)
                                  ((long)&(this->super_BuildWithLogTest).super_BuildTest.
                                          command_runner_.commands_ran_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                                 commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x60,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x6c7,"3u == command_runner_.commands_ran_.size()"), bVar3)) {
      piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
      *piVar1 = *piVar1 + 1;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"in","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      VirtualFileSystem::Create(this_00,&local_90,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"out3","");
      VirtualFileSystem::RemoveFile(this_00,&local_90);
      this_02 = &(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(this_02,(this_02->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
      State::Reset(state);
      pTVar2 = g_current_test;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"out4","");
      pNVar5 = Builder::AddTarget(this_01,&local_90,&local_70);
      testing::Test::Check
                (pTVar2,pNVar5 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x6d4,"builder_.AddTarget(\"out4\", &err)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pTVar2 = g_current_test;
      iVar4 = std::__cxx11::string::compare((char *)&local_70);
      bVar3 = testing::Test::Check
                        (pTVar2,iVar4 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x6d5,"\"\" == err");
      pTVar2 = g_current_test;
      if (bVar3) {
        bVar3 = Builder::Build(this_01,&local_70);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x6d6,"builder_.Build(&err)");
        pTVar2 = g_current_test;
        iVar4 = std::__cxx11::string::compare((char *)&local_70);
        bVar3 = testing::Test::Check
                          (pTVar2,iVar4 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x6d7,"\"\" == err");
        if ((bVar3) &&
           (bVar3 = testing::Test::Check
                              (g_current_test,
                               (long)*(pointer *)
                                      ((long)&(this->super_BuildWithLogTest).super_BuildTest.
                                              command_runner_.commands_ran_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data + 8) -
                               (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                                     commands_ran_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start == 0x60,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0x6d8,"3u == command_runner_.commands_ran_.size()"), bVar3))
        goto LAB_00132d2b;
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00132d2b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildWithLogTest, RestatSingleDependentOutputDirty) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "rule true\n"
    "  command = true\n"
    "  restat = 1\n"
    "rule touch\n"
    "  command = touch\n"
    "build out1: true in\n"
    "build out2 out3: touch out1\n"
    "build out4: touch out2\n"
    ));

  // Create the necessary files
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out4", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());

  fs_.Tick();
  fs_.Create("in", "");
  fs_.RemoveFile("out3");

  // Since "in" is missing, out1 will be built. Since "out3" is missing,
  // out2 and out3 will be built even though "in" is not touched when built.
  // Then, since out2 is rebuilt, out4 should be rebuilt -- the restat on the
  // "true" rule should not lead to the "touch" edge writing out2 and out3 being
  // cleard.
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out4", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
}